

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_memory.c
# Opt level: O0

int memory_write_free(archive *a,void *client_data)

{
  write_memory_data *mine;
  void *client_data_local;
  archive *a_local;
  
  if (client_data != (void *)0x0) {
    free(client_data);
  }
  return 0;
}

Assistant:

static int
memory_write_free(struct archive *a, void *client_data)
{
	struct write_memory_data *mine;
	(void)a; /* UNUSED */
	mine = client_data;
	if (mine == NULL)
		return (ARCHIVE_OK);
	free(mine);
	return (ARCHIVE_OK);
}